

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O2

void obx::anon_unknown_3::cCallbackTrampolineAsyncTreePut(obx_err status,obx_id id,void *userData)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unique_ptr<std::function<void_(const_obx::AsyncTreePutResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreePutResult_&)>_>_>
  callback;
  string errorMessage;
  AsyncTreePutResult result;
  
  if (userData == (void *)0x0) {
    __assert_fail("userData",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/objectbox[P]objectbox-ts-demo/build_O2/_deps/objectbox-download-src/include/objectbox.hpp"
                  ,0xd62,
                  "void obx::(anonymous namespace)::cCallbackTrampolineAsyncTreePut(obx_err, obx_id, void *)"
                 );
  }
  paVar1 = &errorMessage.field_2;
  errorMessage._M_string_length = 0;
  errorMessage.field_2._M_local_buf[0] = '\0';
  errorMessage._M_dataplus._M_p = (pointer)paVar1;
  callback._M_t.
  super___uniq_ptr_impl<std::function<void_(const_obx::AsyncTreePutResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreePutResult_&)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::function<void_(const_obx::AsyncTreePutResult_&)>_*,_std::default_delete<std::function<void_(const_obx::AsyncTreePutResult_&)>_>_>
  .super__Head_base<0UL,_std::function<void_(const_obx::AsyncTreePutResult_&)>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::function<void_(const_obx::AsyncTreePutResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreePutResult_&)>_>,_true,_true>
                  )(__uniq_ptr_data<std::function<void_(const_obx::AsyncTreePutResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreePutResult_&)>_>,_true,_true>
                    )userData;
  if (status == 0) {
    result.result = Success;
  }
  else {
    internal::appendLastErrorText(status,&errorMessage);
    result.result = DidNotPut;
    if (status != 0x3e9) {
      result.result = (uint)(status == 0x194) * 2;
    }
  }
  result.errorMessage._M_string_length = errorMessage._M_string_length;
  result.errorMessage._M_dataplus._M_p = errorMessage._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)errorMessage._M_dataplus._M_p == paVar1) {
    result.errorMessage.field_2._8_8_ = errorMessage.field_2._8_8_;
    result.errorMessage._M_dataplus._M_p = (pointer)&result.errorMessage.field_2;
  }
  result.errorMessage.field_2._M_allocated_capacity._1_7_ =
       errorMessage.field_2._M_allocated_capacity._1_7_;
  result.errorMessage.field_2._M_local_buf[0] = errorMessage.field_2._M_local_buf[0];
  errorMessage._M_string_length = 0;
  errorMessage.field_2._M_local_buf[0] = '\0';
  errorMessage._M_dataplus._M_p = (pointer)paVar1;
  result.status = status;
  result.id = id;
  std::function<void_(const_obx::AsyncTreePutResult_&)>::operator()
            ((function<void_(const_obx::AsyncTreePutResult_&)> *)
             callback._M_t.
             super___uniq_ptr_impl<std::function<void_(const_obx::AsyncTreePutResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreePutResult_&)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::function<void_(const_obx::AsyncTreePutResult_&)>_*,_std::default_delete<std::function<void_(const_obx::AsyncTreePutResult_&)>_>_>
             .super__Head_base<0UL,_std::function<void_(const_obx::AsyncTreePutResult_&)>_*,_false>.
             _M_head_impl,&result);
  std::__cxx11::string::~string((string *)&result.errorMessage);
  std::__cxx11::string::~string((string *)&errorMessage);
  std::
  unique_ptr<std::function<void_(const_obx::AsyncTreePutResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreePutResult_&)>_>_>
  ::~unique_ptr(&callback);
  return;
}

Assistant:

void cCallbackTrampolineAsyncTreePut(obx_err status, obx_id id, void* userData) {
    assert(userData);
    std::unique_ptr<AsyncTreePutCallback> callback(static_cast<AsyncTreePutCallback*>(userData));
    std::string errorMessage;
    if (status != OBX_SUCCESS) internal::appendLastErrorText(status, errorMessage);
    AsyncTreePutResult result{internal::mapErrorToTreePutResult(status), status, id, std::move(errorMessage)};
    (*callback)(result);
}